

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalQuantity::readIntToBcd(DecimalQuantity *this,int32_t n)

{
  int local_24;
  ulong uStack_20;
  int i;
  uint64_t result;
  int32_t n_local;
  DecimalQuantity *this_local;
  
  uStack_20 = 0;
  local_24 = 0x10;
  for (result._4_4_ = n; result._4_4_ != 0; result._4_4_ = result._4_4_ / 10) {
    uStack_20 = (uStack_20 >> 4) + ((ulong)(long)result._4_4_ % 10 << 0x3c);
    local_24 = local_24 + -1;
  }
  (this->fBCD).bcdLong = uStack_20 >> ((byte)(local_24 << 2) & 0x3f);
  this->scale = 0;
  this->precision = 0x10 - local_24;
  return;
}

Assistant:

void DecimalQuantity::readIntToBcd(int32_t n) {
    U_ASSERT(n != 0);
    // ints always fit inside the long implementation.
    uint64_t result = 0L;
    int i = 16;
    for (; n != 0; n /= 10, i--) {
        result = (result >> 4) + ((static_cast<uint64_t>(n) % 10) << 60);
    }
    U_ASSERT(!usingBytes);
    fBCD.bcdLong = result >> (i * 4);
    scale = 0;
    precision = 16 - i;
}